

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::bt_peer_connection::on_receive
          (bt_peer_connection *this,error_code *error,size_t bytes_transferred)

{
  crypto_receive_buffer *this_00;
  byte bVar1;
  receive_buffer *prVar2;
  int iVar3;
  uint uVar4;
  size_t *in_RCX;
  int iVar5;
  uchar *in_R8;
  size_t in_R9;
  cork c_;
  size_t local_48;
  cork local_40;
  error_code local_30;
  
  local_48 = bytes_transferred;
  if (error->failed_ == true) {
    peer_connection::received_bytes(&this->super_peer_connection,0,(int)bytes_transferred);
    return;
  }
  bVar1 = (this->super_peer_connection).m_channel_state.
          super_array<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>,_2UL>
          ._M_elems[0].m_val;
  local_40.m_need_uncork = (bVar1 & 4) == 0;
  if (local_40.m_need_uncork) {
    (this->super_peer_connection).m_channel_state.
    super_array<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>,_2UL>
    ._M_elems[0].m_val = bVar1 | 4;
  }
  local_40.m_pc = &this->super_peer_connection;
  if ((this->m_enc_handler).m_dec_handler.
      super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    on_receive_impl(this,bytes_transferred);
  }
  else {
    this_00 = &this->m_recv_buffer;
    iVar3 = encryption_handler::decrypt
                      (&this->m_enc_handler,(EVP_PKEY_CTX *)this_00,(uchar *)&local_48,in_RCX,in_R8,
                       in_R9);
    iVar5 = iVar3 + (int)local_48;
    if (iVar5 != 0 && SCARRY4(iVar3,(int)local_48) == iVar5 < 0) {
      peer_connection::peer_log
                (&this->super_peer_connection,incoming_message,"ENCRYPTION","decrypted block s = %d"
                );
    }
    if (local_48 == 0xffffffffffffffff) {
      local_30 = errors::make_error_code(parse_failed);
      (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                (this,&local_30,0xf,0);
    }
    else {
      peer_connection::received_bytes(&this->super_peer_connection,0,iVar3);
      if ((this_00->m_recv_pos == 0x7fffffff) ||
         (prVar2 = (this->m_recv_buffer).m_connection_buffer, iVar3 = prVar2->m_packet_size,
         iVar3 - this_00->m_recv_pos < 0x100401 || iVar3 <= prVar2->m_recv_pos)) {
        do {
          if ((local_48 == 0) ||
             (uVar4 = crypto_receive_buffer::advance_pos(this_00,(int)local_48), (int)uVar4 < 1))
          break;
          on_receive_impl(this,(ulong)uVar4);
          local_48 = local_48 - uVar4;
        } while (((this->super_peer_connection).super_peer_connection_hot_members.field_0x28 & 1) ==
                 0);
      }
      else {
        local_30 = errors::make_error_code(packet_too_large);
        (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                  (this,&local_30,0xf,2);
      }
    }
  }
  cork::~cork(&local_40);
  return;
}

Assistant:

void bt_peer_connection::on_receive(error_code const& error
		, std::size_t bytes_transferred)
	{
		INVARIANT_CHECK;

		if (error)
		{
			received_bytes(0, int(bytes_transferred));
			return;
		}

		// make sure are much as possible of the response ends up in the same
		// packet, or at least back-to-back packets
		cork c_(*this);

#if !defined TORRENT_DISABLE_ENCRYPTION
		if (!m_enc_handler.is_recv_plaintext())
		{
			int const consumed = m_enc_handler.decrypt(m_recv_buffer, bytes_transferred);
#ifndef TORRENT_DISABLE_LOGGING
			if (consumed + int(bytes_transferred) > 0)
				peer_log(peer_log_alert::incoming_message, "ENCRYPTION"
					, "decrypted block s = %d", consumed + int(bytes_transferred));
#endif
			if (bytes_transferred == SIZE_MAX)
			{
				disconnect(errors::parse_failed, operation_t::encryption);
				return;
			}
			received_bytes(0, consumed);

			// don't accept packets larger than 1 MB with a 1KB allowance for headers
			if (!m_recv_buffer.crypto_packet_finished()
				&& m_recv_buffer.crypto_packet_size() > 1025 * 1024)
			{
				disconnect(errors::packet_too_large, operation_t::encryption, peer_error);
				return;
			}

			int sub_transferred = 0;
			while (bytes_transferred > 0 &&
				((sub_transferred = m_recv_buffer.advance_pos(int(bytes_transferred))) > 0))
			{
#if TORRENT_USE_ASSERTS
				std::int64_t const cur_payload_dl = m_statistics.last_payload_downloaded();
				std::int64_t const cur_protocol_dl = m_statistics.last_protocol_downloaded();
#endif
				TORRENT_ASSERT(sub_transferred > 0);
				on_receive_impl(std::size_t(sub_transferred));
				bytes_transferred -= std::size_t(sub_transferred);

#if TORRENT_USE_ASSERTS
				TORRENT_ASSERT(m_statistics.last_payload_downloaded() - cur_payload_dl >= 0);
				TORRENT_ASSERT(m_statistics.last_protocol_downloaded() - cur_protocol_dl >= 0);
				std::int64_t const stats_diff = m_statistics.last_payload_downloaded() - cur_payload_dl +
					m_statistics.last_protocol_downloaded() - cur_protocol_dl;
				TORRENT_ASSERT(stats_diff == sub_transferred);
#endif

				if (m_disconnecting) return;
			}
		}
		else
#endif
			on_receive_impl(bytes_transferred);
	}